

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_cleanup_tricore(uc_struct_conflict15 *uc)

{
  int x;
  int iVar1;
  long lVar2;
  
  if ((uc != (uc_struct_conflict15 *)0x0) && (uc->l1_map != (void **)0x0)) {
    iVar1 = uc->v_l1_size;
    x = uc->v_l2_levels;
    if (x < 1) {
      if (0 < iVar1) {
        lVar2 = 0;
        do {
          if (uc->l1_map[lVar2] != (gpointer)0x0) {
            g_free(uc->l1_map[lVar2]);
            uc->l1_map[lVar2] = (void *)0x0;
            iVar1 = uc->v_l1_size;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < iVar1);
      }
    }
    else if (0 < iVar1) {
      lVar2 = 0;
      do {
        if ((void **)uc->l1_map[lVar2] != (void **)0x0) {
          tb_clean_internal((void **)uc->l1_map[lVar2],x);
          uc->l1_map[lVar2] = (void *)0x0;
          iVar1 = uc->v_l1_size;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
  }
  return;
}

Assistant:

void tb_cleanup(struct uc_struct *uc)
{
    int i, x;
    void **p;

    if (uc) {
        if (uc->l1_map) {
            x = uc->v_l2_levels;
            if (x <= 0) {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        g_free(p);
                        uc->l1_map[i] = NULL;
                    }
                }
            } else {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        tb_clean_internal(p, x);
                        uc->l1_map[i] = NULL;
                    }
                }
            }
        }
    }
}